

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STP_Feature.cpp
# Opt level: O0

bool __thiscall sch::s_STN_VVR::operator==(s_STN_VVR *this,s_STN_VVR *vvr)

{
  double dVar1;
  double *pdVar2;
  Scalar epsilon;
  s_STN_VVR *vvr_local;
  s_STN_VVR *this_local;
  
  pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&this->m_axis,0);
  dVar1 = *pdVar2;
  pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&vvr->m_axis,0);
  if (ABS(dVar1 - *pdVar2) < 1e-07) {
    pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&this->m_axis,1);
    dVar1 = *pdVar2;
    pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&vvr->m_axis,1);
    if (ABS(dVar1 - *pdVar2) < 1e-07) {
      pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&this->m_axis,2);
      dVar1 = *pdVar2;
      pdVar2 = CD_Matrix::Vector3T<double,_false>::operator[](&vvr->m_axis,2);
      if ((ABS(dVar1 - *pdVar2) < 1e-07) && (ABS(this->m_cosangle - vvr->m_cosangle) < 1e-07)) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool s_STN_VVR::operator==(const s_STN_VVR & vvr) const
{
  Scalar epsilon = 1e-7;

  if((fabs(m_axis[0] - vvr.m_axis[0]) < epsilon) && (fabs(m_axis[1] - vvr.m_axis[1]) < epsilon)
     && (fabs(m_axis[2] - vvr.m_axis[2]) < epsilon) && (fabs(m_cosangle - vvr.m_cosangle) < epsilon))
    return true;
  else
    return false;
}